

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTimeValidator.cpp
# Opt level: O1

int __thiscall
xercesc_4_0::DateTimeValidator::compare
          (DateTimeValidator *this,XMLCh *value1,XMLCh *value2,MemoryManager *manager)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar4;
  long *plVar3;
  undefined4 extraout_var_00;
  
  iVar1 = (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.super_XSerializable.
            _vptr_XSerializable[0x17])(this,value1,manager);
  plVar3 = (long *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.super_XSerializable.
            _vptr_XSerializable[0x17])(this,value2,manager);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar1);
  iVar2 = (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.super_XSerializable.
            _vptr_XSerializable[0x19])(this,plVar3,plVar4,1);
  iVar1 = -1;
  if (iVar2 != 2) {
    iVar1 = iVar2;
  }
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))(plVar3);
  }
  return iVar1;
}

Assistant:

int DateTimeValidator::compare(const XMLCh* const value1
                             , const XMLCh* const value2
                             , MemoryManager* const manager)
{
    try
    {
        XMLDateTime *pDate1 = parse(value1, manager);
        Janitor<XMLDateTime> jName1(pDate1);
        XMLDateTime *pDate2 = parse(value2, manager);
        Janitor<XMLDateTime> jName2(pDate2);
        int result = compareDates(pDate1, pDate2, true);
        return (result==INDETERMINATE)? -1 : result;
    }
    catch(const OutOfMemoryException&)
    {
        throw;
    }
    catch (...) // RuntimeException e
    {
        return -1; // revisit after implement compareDates()
    }

}